

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_test.cxx
# Opt level: O3

void __thiscall array_digest_test::test_method(array_digest_test *this)

{
  int iVar1;
  uchar *in_RCX;
  array<char,_4UL> *in_RDX;
  type array;
  char *local_120;
  string *local_118;
  undefined1 local_110 [8];
  undefined8 local_108;
  shared_count sStack_100;
  digest_type hash;
  string str;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined **local_90;
  undefined1 local_88;
  undefined8 *local_80;
  char *local_78;
  undefined **local_70;
  undefined1 local_68;
  undefined8 *local_60;
  char **local_58;
  undefined **local_50;
  undefined1 local_48;
  undefined8 *local_40;
  string **local_38;
  
  array._M_elems[0] = '\0';
  array._M_elems[1] = '\x10';
  array._M_elems[2] = ' ';
  array._M_elems[3] = '0';
  cryptox::digest<cryptox::message_digest_algorithm<&EVP_sha1,160ul>,std::array<char,4ul>>
            ((type *)&hash,(cryptox *)&array,in_RDX);
  cryptox::to_hex<unsigned_char_const*>(&str,(cryptox *)&hash,(uchar *)&str,in_RCX);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
  ;
  local_a8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x2b);
  local_88 = 0;
  local_90 = &PTR__lazy_ostream_002e0fe0;
  local_80 = &boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  iVar1 = std::__cxx11::string::compare((char *)&str);
  local_110[0] = iVar1 == 0;
  local_108 = 0;
  sStack_100.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
  ;
  local_98 = "";
  local_38 = &local_118;
  local_48 = 0;
  local_50 = &PTR__lazy_ostream_002e1030;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_58 = &local_120;
  local_120 = "e89fc658068627378403ebfdcefcb13250579b50";
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_002e14a0;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_118 = &str;
  boost::test_tools::tt_detail::report_assertion
            (local_110,&local_90,&local_a0,0x2b,1,2,2,"str",&local_50,
             "\"e89fc658068627378403ebfdcefcb13250579b50\"",&local_70);
  boost::detail::shared_count::~shared_count(&sStack_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != &str.field_2) {
    operator_delete(str._M_dataplus._M_p);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(array_digest_test) {
	const cryptox::array<char, 4>::type array = { 0x00, 0x10, 0x20, 0x30 };
	const sha1::digest_type hash = digest<sha1>(array);
	const std::string str = to_hex(hash);
	BOOST_CHECK_EQUAL(str, "e89fc658068627378403ebfdcefcb13250579b50");
}